

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedundantSetElimination.cpp
# Opt level: O2

void wasm::anon_unknown_101::RedundantSetElimination::doVisitLocalSet
               (RedundantSetElimination *self,Expression **currp)

{
  BasicBlock *pBVar1;
  Expression **local_10;
  Expression **currp_local;
  
  pBVar1 = (self->
           super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
           ).
           super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
           .currBasicBlock;
  if (pBVar1 != (BasicBlock *)0x0) {
    local_10 = currp;
    std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::push_back
              (&(pBVar1->contents).items,&local_10);
  }
  return;
}

Assistant:

static void doVisitLocalSet(RedundantSetElimination* self,
                              Expression** currp) {
    if (self->currBasicBlock) {
      self->currBasicBlock->contents.items.push_back(currp);
    }
  }